

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<int>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<int>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>
               *this,int i)

{
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar1;
  Fad<double> *pFVar2;
  Fad<double> *pFVar3;
  Fad<double> *pFVar4;
  Fad<double> *pFVar5;
  double dVar6;
  
  pFVar1 = (this->left_->fadexpr_).right_;
  pFVar2 = (pFVar1->fadexpr_).left_;
  pFVar3 = (pFVar1->fadexpr_).right_;
  dVar6 = (double)(this->left_->fadexpr_).left_.constant_;
  pFVar4 = (this->right_->fadexpr_).left_;
  pFVar5 = (this->right_->fadexpr_).right_;
  return (pFVar2->val_ + pFVar3->val_) * dVar6 *
         ((pFVar4->dx_).ptr_to_data[i] + (pFVar5->dx_).ptr_to_data[i]) +
         (pFVar4->val_ + pFVar5->val_) *
         ((pFVar2->dx_).ptr_to_data[i] + (pFVar3->dx_).ptr_to_data[i]) * dVar6;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}